

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

void test_next_on_map(uint32_t count)

{
  char *data;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar5;
  char *d3;
  char *d2;
  char *pcVar4;
  
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  uVar3 = 0;
  fprintf(_stdout,"next/check on map(%u)",count);
  fputc(10,_stdout);
  data = mp_encode_map(buf + 1,count);
  iVar1 = count * 2;
  while( true ) {
    bVar5 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar5) break;
    data = mp_encode_uint(data,uVar3 % 0x7f);
    uVar3 = uVar3 + 1;
  }
  iVar1 = 1;
  if (0xf < count) {
    iVar1 = (0xffff < count) + 3 + (uint)(0xffff < count);
  }
  uVar2 = iVar1 + count * 2;
  pcVar4 = (char *)(ulong)uVar2;
  d2 = buf + 1;
  d3 = buf + 1;
  iVar1 = mp_check(&d2,str);
  _ok((uint)(iVar1 == 0),"!mp_check(&d2, data + BUF_MAXLEN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2d4,
      "mp_check(map %u))",count);
  _ok((uint)(data + -0x148121 == pcVar4),"(d1 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2d5,
      "len(map %u) == %u",count,uVar2);
  _ok((uint)(d2 + -0x148121 == pcVar4),"(d2 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2d6,
      "len(mp_check(map %u)) == %u",count,uVar2);
  mp_next(&d3);
  _ok((uint)(d3 + -0x148121 == pcVar4),"(d3 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2d8,
      "len(mp_next(map %u)) == %u",count,uVar2);
  return;
}

Assistant:

static void
test_next_on_map(uint32_t count)
{
	note("next/check on map(%u)", count);
	char *d1 = data;
	d1 = mp_encode_map(d1, count);
	for (uint32_t i = 0; i < 2 * count; i++) {
		d1 = mp_encode_uint(d1, i % 0x7f); /* one byte */
	}
	uint32_t len = 2 * count + mp_sizeof_map(count);
	const char *d2 = data;
	const char *d3 = data;
	ok(!mp_check(&d2, data + BUF_MAXLEN), "mp_check(map %u))", count);
	is((d1 - data), (ptrdiff_t)len, "len(map %u) == %u", count, len);
	is((d2 - data), (ptrdiff_t)len, "len(mp_check(map %u)) == %u", count, len);
	mp_next(&d3);
	is((d3 - data), (ptrdiff_t)len, "len(mp_next(map %u)) == %u", count, len);
}